

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction
          (ParquetKeyValueMetadataFunction *this)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_61;
  LogicalType local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"parquet_kv_metadata","");
  LogicalType::LogicalType(&local_60,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_61);
  TableFunction::TableFunction
            (&this->super_TableFunction,&local_30,(vector<duckdb::LogicalType,_true> *)&local_48,
             ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)2>,
             ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)2>,
             (table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  (this->super_TableFunction).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
  ._vptr_Function = (_func_int **)&PTR__TableFunction_024b5f00;
  return;
}

Assistant:

ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction()
    : TableFunction("parquet_kv_metadata", {LogicalType::VARCHAR},
                    ParquetMetaDataImplementation<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataBind<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>,
                    ParquetMetaDataInit<ParquetMetadataOperatorType::KEY_VALUE_META_DATA>) {
}